

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void explainSimpleCount(Parse *pParse,Table *pTab,Index *pIdx)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  
  if (pParse->explain != '\x02') {
    return;
  }
  if (pIdx == (Index *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if ((pTab->tabFlags & 0x80) != 0) {
      bVar3 = (*(ushort *)&pIdx->field_0x63 & 3) != 2;
    }
  }
  pcVar1 = " USING COVERING INDEX ";
  pcVar2 = "";
  if (bVar3) {
    pcVar2 = pIdx->zName;
  }
  else {
    pcVar1 = "";
  }
  sqlite3VdbeExplain(pParse,'\0',"SCAN %s%s%s",pTab->zName,pcVar1,pcVar2);
  return;
}

Assistant:

static void explainSimpleCount(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being queried */
  Index *pIdx                     /* Index used to optimize scan, or NULL */
){
  if( pParse->explain==2 ){
    int bCover = (pIdx!=0 && (HasRowid(pTab) || !IsPrimaryKeyIndex(pIdx)));
    sqlite3VdbeExplain(pParse, 0, "SCAN %s%s%s",
        pTab->zName,
        bCover ? " USING COVERING INDEX " : "",
        bCover ? pIdx->zName : ""
    );
  }
}